

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

bool __thiscall
dxil_spv::Converter::Impl::type_can_relax_precision(Impl *this,Type *type,bool known_integer_sign)

{
  TypeID TVar1;
  uint uVar2;
  LoggingCallback p_Var3;
  void *pvVar4;
  char acStack_1018 [4096];
  
  if ((this->options).arithmetic_relaxed_precision == true) {
    TVar1 = LLVMBC::Type::getTypeID(type);
    if (TVar1 == ArrayTyID) {
      TVar1 = LLVMBC::Type::getTypeID(type);
      if (TVar1 != ArrayTyID) {
        p_Var3 = get_thread_log_callback();
        if (p_Var3 == (LoggingCallback)0x0) {
          type_can_relax_precision();
          std::terminate();
        }
        goto LAB_0012080e;
      }
      type = LLVMBC::Type::getArrayElementType(type);
    }
    TVar1 = LLVMBC::Type::getTypeID(type);
    if (TVar1 == VectorTyID) {
      TVar1 = LLVMBC::Type::getTypeID(type);
      if (TVar1 != VectorTyID) {
        p_Var3 = get_thread_log_callback();
        if (p_Var3 == (LoggingCallback)0x0) {
          type_can_relax_precision();
          std::terminate();
        }
LAB_0012080e:
        builtin_strncpy(acStack_1018 + 0x10,"in cast<T>.\n",0xd);
        builtin_strncpy(acStack_1018,"Invalid type ID ",0x10);
        pvVar4 = get_thread_log_callback_userdata();
        (*p_Var3)(pvVar4,Error,acStack_1018);
        std::terminate();
      }
      type = LLVMBC::VectorType::getElementType((VectorType *)type);
    }
    if (((this->execution_mode_meta).native_16bit_operations == false) &&
       ((this->options).min_precision_prefer_native_16bit == false)) {
      TVar1 = LLVMBC::Type::getTypeID(type);
      if (TVar1 == HalfTyID) {
        return true;
      }
      TVar1 = LLVMBC::Type::getTypeID(type);
      if (TVar1 == IntegerTyID) {
        uVar2 = LLVMBC::Type::getIntegerBitWidth(type);
        return uVar2 == 0x10 && known_integer_sign;
      }
    }
  }
  return false;
}

Assistant:

bool Converter::Impl::type_can_relax_precision(const llvm::Type *type, bool known_integer_sign) const
{
	if (!options.arithmetic_relaxed_precision)
		return false;

	if (type->getTypeID() == llvm::Type::TypeID::ArrayTyID)
		type = llvm::cast<llvm::ArrayType>(type)->getArrayElementType();
	if (type->getTypeID() == llvm::Type::TypeID::VectorTyID)
		type = llvm::cast<llvm::VectorType>(type)->getElementType();

	return (!execution_mode_meta.native_16bit_operations && !options.min_precision_prefer_native_16bit) &&
	       (type->getTypeID() == llvm::Type::TypeID::HalfTyID ||
	        (type->getTypeID() == llvm::Type::TypeID::IntegerTyID && type->getIntegerBitWidth() == 16 &&
	         known_integer_sign));
}